

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O1

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
thread_remove_scheduling
          (MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
          _threads_iterator thread)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  pair<std::_Rb_tree_iterator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::_Rb_tree_iterator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>_>
  pVar4;
  
  p_Var3 = (this->scheduling)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->scheduling)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    _Var2 = *(_Rb_tree_color *)&thread._M_node[1]._M_left;
    do {
      if (p_Var3[1]._M_color == _Var2) break;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    pVar4 = std::
            _Rb_tree<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_std::_Identity<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::less<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>_>
            ::equal_range(&(this->scheduling)._M_t,(key_type *)(p_Var3 + 1));
    std::
    _Rb_tree<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation,_std::_Identity<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::less<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::SchedulingInformation>_>
    ::_M_erase_aux(&(this->scheduling)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    return;
  }
  return;
}

Assistant:

void thread_remove_scheduling(_threads_iterator thread) {
				auto it = getSchedulingFor(thread);
				if (it != scheduling.end()) {
					scheduling.erase(*it);
				}
			}